

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O2

LY_ERR ly_parse_int(char *val_str,size_t val_len,int64_t min,int64_t max,int base,int64_t *ret)

{
  char cVar1;
  char *in_RAX;
  char *pcVar2;
  int *piVar3;
  longlong lVar4;
  ushort **ppuVar5;
  LY_ERR LVar6;
  bool bVar7;
  char *local_38;
  
  if (val_str == (char *)0x0) {
    pcVar2 = "val_str";
LAB_0010f46c:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_parse_int");
    return LY_EINVAL;
  }
  if (*val_str == '\0') {
    pcVar2 = "val_str[0]";
    goto LAB_0010f46c;
  }
  if (val_len == 0) {
    pcVar2 = "val_len";
    goto LAB_0010f46c;
  }
  local_38 = in_RAX;
  pcVar2 = strndup(val_str,val_len);
  if (pcVar2 == (char *)0x0) {
    return LY_EMEM;
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  lVar4 = strtoll(pcVar2,&local_38,base);
  LVar6 = LY_EVALID;
  if ((*piVar3 == 0) && (local_38 != pcVar2)) {
    LVar6 = LY_SUCCESS;
    if (lVar4 <= max && min <= lVar4) {
      if (*local_38 == '\0') {
        bVar7 = true;
      }
      else {
        ppuVar5 = __ctype_b_loc();
        do {
          cVar1 = *local_38;
          local_38 = local_38 + 1;
        } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        bVar7 = cVar1 == '\0';
        LVar6 = LY_EVALID;
        if (bVar7) {
          LVar6 = LY_SUCCESS;
        }
      }
      goto LAB_0010f42c;
    }
    LVar6 = LY_EDENIED;
  }
  bVar7 = false;
LAB_0010f42c:
  free(pcVar2);
  if (!bVar7) {
    return LVar6;
  }
  *ret = lVar4;
  return LVar6;
}

Assistant:

LY_ERR
ly_parse_int(const char *val_str, size_t val_len, int64_t min, int64_t max, int base, int64_t *ret)
{
    LY_ERR rc = LY_SUCCESS;
    char *ptr, *str;
    int64_t i;

    LY_CHECK_ARG_RET(NULL, val_str, val_str[0], val_len, LY_EINVAL);

    /* duplicate the value */
    str = strndup(val_str, val_len);
    LY_CHECK_RET(!str, LY_EMEM);

    /* parse the value to avoid accessing following bytes */
    errno = 0;
    i = strtoll(str, &ptr, base);
    if (errno || (ptr == str)) {
        /* invalid string */
        rc = LY_EVALID;
    } else if ((i < min) || (i > max)) {
        /* invalid number */
        rc = LY_EDENIED;
    } else if (*ptr) {
        while (isspace(*ptr)) {
            ++ptr;
        }
        if (*ptr) {
            /* invalid characters after some number */
            rc = LY_EVALID;
        }
    }

    /* cleanup */
    free(str);
    if (!rc) {
        *ret = i;
    }
    return rc;
}